

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * matchid(disctx *ctx,int spos,char *v)

{
  int *piVar1;
  int iVar2;
  matches *pmVar3;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  expr *e;
  int in_stack_00000094;
  
  if (((in_ESI != *(int *)(*(long *)(in_RDI + 0x50) + 0x18)) &&
      (piVar1 = *(int **)(*(long *)(*(long *)(in_RDI + 0x50) + 0x10) + (long)in_ESI * 8),
      *piVar1 == 1)) && (iVar2 = strcmp(*(char **)(piVar1 + 2),in_RDX), iVar2 == 0)) {
    pmVar3 = alwaysmatches(in_stack_00000094);
    return pmVar3;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *matchid(struct disctx *ctx, int spos, const char *v) {
	if (spos == ctx->line->atomsnum)
		return 0;
	struct expr *e = ctx->line->atoms[spos];
	if (e->type == EXPR_ID && !strcmp(e->str, v))
		return alwaysmatches(spos+1);
	else
		return 0;
}